

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_symbol_codec.cpp
# Opt level: O2

bool __thiscall lzham::symbol_codec::record_put_bits(symbol_codec *this,uint bits,uint num_bits)

{
  bool bVar1;
  output_symbol sym;
  output_symbol local_8;
  
  if (num_bits != 0) {
    this->m_total_bits_written = this->m_total_bits_written + num_bits;
    local_8.m_num_bits = (short)num_bits;
    local_8.m_bits = bits;
    local_8.m_arith_prob0 = 0;
    bVar1 = vector<lzham::symbol_codec::output_symbol>::try_push_back(&this->m_output_syms,&local_8)
    ;
    return bVar1;
  }
  return true;
}

Assistant:

bool symbol_codec::record_put_bits(uint bits, uint num_bits)
   {
      LZHAM_ASSERT(m_mode == cEncoding);

      LZHAM_ASSERT(num_bits <= 25);
      LZHAM_ASSERT(m_bit_count >= 25);

      if (!num_bits)
         return true;

      m_total_bits_written += num_bits;

      output_symbol sym;
      sym.m_bits = bits;
      sym.m_num_bits = (uint16)num_bits;
      sym.m_arith_prob0 = 0;
      if (!m_output_syms.try_push_back(sym))
         return false;

      return true;
   }